

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterXsYs<float>>
               (GetterXsYs<float> getter,TransformerLogLog transformer,ImDrawList *DrawList,
               ImPlotMarker marker,float size,bool rend_mk_line,ImU32 col_mk_line,float weight,
               bool rend_mk_fill,ImU32 col_mk_fill)

{
  ImVec2 IVar1;
  undefined8 uVar2;
  ImPlotPlot *pIVar3;
  double dVar4;
  double dVar5;
  ImPlotContext *pIVar6;
  ImPlotContext *pIVar7;
  long lVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ImVec2 c;
  ImVec2 local_70;
  undefined1 local_68 [16];
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  pIVar6 = GImPlot;
  if (0 < getter.Count) {
    iVar9 = 0;
    do {
      pIVar7 = GImPlot;
      lVar8 = (long)(((getter.Offset + iVar9) % getter.Count + getter.Count) % getter.Count) *
              (long)getter.Stride;
      fVar10 = *(float *)((long)getter.Ys + lVar8);
      dVar4 = log10((double)*(float *)((long)getter.Xs + lVar8) /
                    (GImPlot->CurrentPlot->XAxis).Range.Min);
      pIVar3 = pIVar7->CurrentPlot;
      local_68._8_4_ = extraout_XMM0_Dc;
      local_68._0_8_ = dVar4;
      local_68._12_4_ = extraout_XMM0_Dd;
      local_58 = pIVar7->LogDenX;
      uStack_50 = 0;
      dVar4 = (pIVar3->XAxis).Range.Min;
      local_48 = (pIVar3->XAxis).Range.Max;
      uStack_40 = 0;
      dVar5 = log10((double)fVar10 / pIVar3->YAxis[transformer.YAxis].Range.Min);
      pIVar3 = pIVar7->CurrentPlot;
      auVar12._8_8_ = dVar5;
      auVar12._0_8_ = local_68._0_8_;
      auVar13._8_4_ = SUB84(pIVar7->LogDenY[transformer.YAxis],0);
      auVar13._0_8_ = local_58;
      auVar13._12_4_ = (int)((ulong)pIVar7->LogDenY[transformer.YAxis] >> 0x20);
      auVar13 = divpd(auVar12,auVar13);
      dVar5 = pIVar3->YAxis[transformer.YAxis].Range.Min;
      IVar1 = pIVar7->PixelRange[transformer.YAxis].Min;
      fVar10 = (float)(pIVar7->Mx *
                       (((double)(float)auVar13._0_8_ * (local_48 - dVar4) + dVar4) -
                       (pIVar3->XAxis).Range.Min) + (double)IVar1.x);
      fVar11 = (float)(pIVar7->My[transformer.YAxis] *
                       (((double)(float)auVar13._8_8_ *
                         (pIVar3->YAxis[transformer.YAxis].Range.Max - dVar5) + dVar5) - dVar5) +
                      (double)IVar1.y);
      local_70.y = fVar11;
      local_70.x = fVar10;
      pIVar3 = pIVar6->CurrentPlot;
      if (((((pIVar3->PlotRect).Min.x <= fVar10) &&
           (uVar2 = *(undefined8 *)&(pIVar3->PlotRect).Min.y, (float)uVar2 <= fVar11)) &&
          (fVar10 < (float)((ulong)uVar2 >> 0x20))) && (fVar11 < (pIVar3->PlotRect).Max.y)) {
        (*RenderMarkers<ImPlot::TransformerLogLog,_ImPlot::GetterXsYs<float>_>::marker_table[marker]
        )(DrawList,&local_70,size,rend_mk_line,col_mk_line,rend_mk_fill,col_mk_fill,weight);
      }
      iVar9 = iVar9 + 1;
    } while (getter.Count != iVar9);
  }
  return;
}

Assistant:

inline void RenderMarkers(Getter getter, Transformer transformer, ImDrawList& DrawList, ImPlotMarker marker, float size, bool rend_mk_line, ImU32 col_mk_line, float weight, bool rend_mk_fill, ImU32 col_mk_fill) {
    static void (*marker_table[ImPlotMarker_COUNT])(ImDrawList&, const ImVec2&, float s, bool, ImU32, bool, ImU32, float) = {
        RenderMarkerCircle,
        RenderMarkerSquare,
        RenderMarkerDiamond ,
        RenderMarkerUp ,
        RenderMarkerDown ,
        RenderMarkerLeft,
        RenderMarkerRight,
        RenderMarkerCross,
        RenderMarkerPlus,
        RenderMarkerAsterisk
    };
    ImPlotContext& gp = *GImPlot;
    for (int i = 0; i < getter.Count; ++i) {
        ImVec2 c = transformer(getter(i));
        if (gp.CurrentPlot->PlotRect.Contains(c))
            marker_table[marker](DrawList, c, size, rend_mk_line, col_mk_line, rend_mk_fill, col_mk_fill, weight);
    }
}